

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_ext_dup(lys_module *mod,lys_ext_instance **orig,uint8_t size,void *parent,
               LYEXT_PAR parent_type,lys_ext_instance ***new,unres_schema *unres)

{
  uint8_t size_00;
  lys_ext_instance *plVar1;
  undefined8 *puVar2;
  lys_ext_instance **pplVar3;
  int iVar4;
  lys_ext_instance *e;
  lys_ext *plVar5;
  lys_node *snode;
  lyxml_elem *plVar6;
  char *pcVar7;
  LY_ERR *pLVar8;
  ulong uVar9;
  lys_ext_instance **local_40;
  lys_ext_instance **orig_local;
  
  local_40 = orig;
  orig_local = (lys_ext_instance **)new;
  if (new == (lys_ext_instance ***)0x0) {
    __assert_fail("new",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x507,
                  "int lys_ext_dup(struct lys_module *, struct lys_ext_instance **, uint8_t, void *, LYEXT_PAR, struct lys_ext_instance ***, struct unres_schema *)"
                 );
  }
  if (size == '\0') {
    if (orig != (lys_ext_instance **)0x0) {
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
             ,0x50b);
      return 1;
    }
    *new = (lys_ext_instance **)0x0;
  }
  else {
    e = (lys_ext_instance *)calloc((ulong)size,8);
    *orig_local = e;
    for (uVar9 = 0; pplVar3 = local_40, size != uVar9; uVar9 = uVar9 + 1) {
      plVar1 = local_40[uVar9];
      if (plVar1 == (lys_ext_instance *)0x0) {
        iVar4 = unres_schema_find(unres,-1,&local_40,UNRES_EXT);
        if (iVar4 == -1) {
          pLVar8 = ly_errno_location();
          *pLVar8 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                 ,0x53a);
LAB_001508a7:
          *orig_local = (lys_ext_instance *)0x0;
          lys_extension_instances_free(mod->ctx,(lys_ext_instance **)e,(uint)uVar9);
          return 1;
        }
        puVar2 = (undefined8 *)unres->str_snode[iVar4];
        snode = (lys_node *)malloc(0x30);
        iVar4 = *(int *)(puVar2 + 1);
        *(int *)&snode->dsc = iVar4;
        if (iVar4 == 2) {
          plVar6 = lyxml_dup_elem(mod->ctx,(lyxml_elem *)*puVar2,(lyxml_elem *)0x0,1);
          snode->name = &plVar6->flags;
        }
        snode->ref = (char *)parent;
        *(lys_module **)&snode->flags = mod;
        *(LYEXT_PAR *)&snode->ext = parent_type;
        *(char *)((long)&snode->iffeature + 1) = (char)uVar9;
        iVar4 = unres_schema_add_node(mod,unres,orig_local,UNRES_EXT,snode);
        if (iVar4 == -1) goto LAB_001508a7;
      }
      else {
        if (plVar1->ext_type == '\0') {
          plVar5 = (lys_ext *)malloc(0x28);
          (&e->def)[uVar9] = plVar5;
        }
        else if (plVar1->ext_type == '\x01') {
          plVar5 = (lys_ext *)calloc(1,(size_t)plVar1->def->plugin[1].check_position);
          (&e->def)[uVar9] = plVar5;
          *(undefined4 *)&plVar5->plugin = 0x10000;
          plVar5->module = mod;
          plVar5->argument = *(char **)(pplVar3[uVar9]->def->plugin + 1);
        }
        else {
          plVar5 = (&e->def)[uVar9];
        }
        plVar5->name = (char *)pplVar3[uVar9]->def;
        (&e->def)[uVar9]->flags = 0;
        pcVar7 = lydict_insert(mod->ctx,local_40[uVar9]->arg_value,0);
        (&e->def)[uVar9]->ref = pcVar7;
        (&e->def)[uVar9]->dsc = (char *)parent;
        plVar5 = (&e->def)[uVar9];
        plVar5->padding[2] = (uint8_t)parent_type;
        plVar1 = local_40[uVar9];
        plVar5->padding[1] = plVar1->insubstmt;
        plVar5->padding[0] = plVar1->insubstmt_index;
        plVar5->padding[3] = plVar1->ext_type;
        plVar1->ext = (lys_ext_instance **)0x0;
        plVar1 = local_40[uVar9];
        size_00 = plVar1->ext_size;
        plVar5 = (&e->def)[uVar9];
        plVar5->ext_size = size_00;
        iVar4 = lys_ext_dup(mod,plVar1->ext,size_00,plVar5,LYEXT_PAR_EXTINST,&plVar5->ext,unres);
        if (iVar4 != 0) goto LAB_001508a7;
      }
    }
  }
  return 0;
}

Assistant:

int
lys_ext_dup(struct lys_module *mod, struct lys_ext_instance **orig, uint8_t size,
            void *parent, LYEXT_PAR parent_type, struct lys_ext_instance ***new, struct unres_schema *unres)
{
    int i;
    uint8_t u = 0;
    struct lys_ext_instance **result;
    struct unres_ext *info, *info_orig;

    assert(new);

    if (!size) {
        if (orig) {
            LOGINT;
            return EXIT_FAILURE;
        }
        (*new) = NULL;
        return EXIT_SUCCESS;
    }

    (*new) = result = calloc(size, sizeof *result);
    for (u = 0; u < size; u++) {
        /* TODO cover complex extension instances */

        if (orig[u]) {
            /* resolved extension instance, just duplicate it */
            switch(orig[u]->ext_type) {
            case LYEXT_FLAG:
                result[u] = malloc(sizeof(struct lys_ext_instance));
                break;
            case LYEXT_COMPLEX:
                result[u] = calloc(1, ((struct lyext_plugin_complex*)orig[u]->def->plugin)->instance_size);
                ((struct lys_ext_instance_complex*)result[u])->nodetype = LYS_EXT;
                ((struct lys_ext_instance_complex*)result[u])->module = mod;
                ((struct lys_ext_instance_complex*)result[u])->substmt = ((struct lyext_plugin_complex*)orig[u]->def->plugin)->substmt;
                /* TODO duplicate data in extension instance content */
                break;
            }
            /* generic part */
            result[u]->def = orig[u]->def;
            result[u]->flags = 0;
            result[u]->arg_value = lydict_insert(mod->ctx, orig[u]->arg_value, 0);
            result[u]->parent = parent;
            result[u]->parent_type = parent_type;
            result[u]->insubstmt = orig[u]->insubstmt;
            result[u]->insubstmt_index = orig[u]->insubstmt_index;
            result[u]->ext_type = orig[u]->ext_type;

            /* extensions */
            orig[u]->ext = NULL;
            result[u]->ext_size = orig[u]->ext_size;
            if (lys_ext_dup(mod, orig[u]->ext, orig[u]->ext_size, result[u],
                            LYEXT_PAR_EXTINST, &result[u]->ext, unres)) {
                goto error;
            }
        } else {
            /* original extension is not yet resolved, so duplicate it in unres */
            i = unres_schema_find(unres, -1, &orig, UNRES_EXT);
            if (i == -1) {
                /* extension not found in unres */
                LOGINT;
                goto error;
            }
            info_orig = unres->str_snode[i];
            info = malloc(sizeof *info);
            info->datatype = info_orig->datatype;
            if (info->datatype == LYS_IN_YIN) {
                info->data.yin = lyxml_dup_elem(mod->ctx, info_orig->data.yin, NULL, 1);
            } /* else TODO YANG */
            info->parent = parent;
            info->mod = mod;
            info->parent_type = parent_type;
            info->ext_index = u;
            if (unres_schema_add_node(info->mod, unres, new, UNRES_EXT, (struct lys_node *)info) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;

error:
    (*new) = NULL;
    lys_extension_instances_free(mod->ctx, result, u);
    return EXIT_FAILURE;
}